

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMemCheckHandler::GenerateCTestXML(cmCTestMemCheckHandler *this,cmXMLWriter *xml)

{
  int *piVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  pointer pcVar5;
  pointer piVar6;
  ostream *poVar7;
  pointer pcVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  cmCTestTestResult *result;
  long lVar12;
  ulong uVar13;
  int local_244;
  string output;
  string outname;
  vector<int,_std::allocator<int>_> memcheckresults;
  char *local_1c8 [4];
  string testPath;
  
  bVar3 = cmCTest::GetProduceXML((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest)
  ;
  if (!bVar3) {
    return;
  }
  cmCTest::StartXML((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,xml,
                    (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.AppendXML);
  cmCTest::GenerateSubprojectsOutput
            ((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testPath,"DynamicAnalysis",(allocator<char> *)&output);
  cmXMLWriter::StartElement(xml,&testPath);
  std::__cxx11::string::~string((string *)&testPath);
  switch(this->MemoryTesterStyle) {
  case 1:
    pcVar9 = "Valgrind";
    goto LAB_00474433;
  case 2:
    cmXMLWriter::Attribute<char[7]>(xml,"Checker",(char (*) [7])0x6908fb);
    break;
  case 3:
    pcVar9 = "DrMemory";
LAB_00474433:
    cmXMLWriter::Attribute<char[9]>(xml,"Checker",(char (*) [9])pcVar9);
    break;
  case 4:
    pcVar9 = "BoundsChecker";
    goto LAB_0047449e;
  case 5:
    pcVar9 = "CudaSanitizer";
    goto LAB_0047449e;
  case 6:
    cmXMLWriter::Attribute<char[17]>(xml,"Checker",(char (*) [17])"AddressSanitizer");
    break;
  case 7:
    pcVar9 = "LeakSanitizer";
LAB_0047449e:
    cmXMLWriter::Attribute<char[14]>(xml,"Checker",(char (*) [14])pcVar9);
    break;
  case 8:
    pcVar9 = "ThreadSanitizer";
    goto LAB_004744ce;
  case 9:
    pcVar9 = "MemorySanitizer";
LAB_004744ce:
    cmXMLWriter::Attribute<char[16]>(xml,"Checker",(char (*) [16])pcVar9);
    break;
  case 10:
    cmXMLWriter::Attribute<char[27]>(xml,"Checker",(char (*) [27])"UndefinedBehaviorSanitizer");
    break;
  default:
    cmXMLWriter::Attribute<char[8]>(xml,"Checker",(char (*) [8])0x6a68a5);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testPath,"StartDateTime",(allocator<char> *)&output);
  cmXMLWriter::Element<std::__cxx11::string>
            (xml,&testPath,&(this->super_cmCTestTestHandler).StartTest);
  std::__cxx11::string::~string((string *)&testPath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testPath,"StartTestTime",(allocator<char> *)&output);
  cmXMLWriter::
  Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            (xml,&testPath,&(this->super_cmCTestTestHandler).StartTestTime);
  std::__cxx11::string::~string((string *)&testPath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testPath,"TestList",(allocator<char> *)&output);
  cmXMLWriter::StartElement(xml,&testPath);
  std::__cxx11::string::~string((string *)&testPath);
  pcVar8 = (this->super_cmCTestTestHandler).TestResults.
           super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pcVar5 = (this->super_cmCTestTestHandler).TestResults.
                super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                ._M_impl.super__Vector_impl_data._M_start; pcVar5 != pcVar8; pcVar5 = pcVar5 + 1) {
    std::operator+(&output,&pcVar5->Path,"/");
    std::operator+(&testPath,&output,&pcVar5->Name);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"Test",(allocator<char> *)local_1c8);
    cmCTest::GetShortPathToFile
              (&outname,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,&testPath
              );
    cmXMLWriter::Element<std::__cxx11::string>(xml,&output,&outname);
    std::__cxx11::string::~string((string *)&outname);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&testPath);
  }
  cmXMLWriter::EndElement(xml);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&testPath);
  std::operator<<((ostream *)&testPath,"-- Processing memory checking output:\n");
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x169,output._M_dataplus._M_p,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testPath);
  pcVar5 = (this->super_cmCTestTestHandler).TestResults.
           super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar8 = (this->super_cmCTestTestHandler).TestResults.
           super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar11 = 0; uVar11 < (ulong)(((long)pcVar8 - (long)pcVar5) / 0x170); uVar11 = uVar11 + 1) {
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    testPath._M_dataplus._M_p._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&memcheckresults,
               (long)(this->ResultStrings).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->ResultStrings).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,
               (value_type_conflict1 *)&testPath,(allocator_type *)&outname);
    result = pcVar5 + uVar11;
    bVar3 = ProcessMemCheckOutput(this,&result->Output,&output,&memcheckresults);
    if (!bVar3 || result->Status != 9) {
      cmCTestTestHandler::CleanTestOutput
                (&this->super_cmCTestTestHandler,&output,
                 (long)(this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize,
                 (this->super_cmCTestTestHandler).TestOutputTruncation);
      cmCTestTestHandler::WriteTestResultHeader(&this->super_cmCTestTestHandler,xml,result);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&testPath,"Results",(allocator<char> *)&outname);
      cmXMLWriter::StartElement(xml,&testPath);
      std::__cxx11::string::~string((string *)&testPath);
      lVar10 = 0;
      lVar12 = 0;
      local_244 = 0;
      piVar6 = memcheckresults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar13 = 0;
          uVar13 < (ulong)((long)memcheckresults.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
          uVar13 = uVar13 + 1) {
        if (*(int *)((long)piVar6 + lVar12) == 0) {
          iVar4 = 0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&testPath,"Defect",(allocator<char> *)&outname);
          cmXMLWriter::StartElement(xml,&testPath);
          std::__cxx11::string::~string((string *)&testPath);
          cmXMLWriter::Attribute<std::__cxx11::string>
                    (xml,"type",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((this->ResultStringsLong).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar10));
          cmXMLWriter::Content<int>
                    (xml,(int *)((long)memcheckresults.super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar12));
          iVar4 = *(int *)((long)memcheckresults.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar12);
          cmXMLWriter::EndElement(xml);
          local_244 = local_244 + iVar4;
          iVar4 = *(int *)((long)memcheckresults.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar12);
          piVar6 = memcheckresults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        piVar1 = (int *)((long)(this->GlobalResults).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar12);
        *piVar1 = *piVar1 + iVar4;
        lVar12 = lVar12 + 4;
        lVar10 = lVar10 + 0x20;
      }
      cmXMLWriter::EndElement(xml);
      if (0 < local_244) {
        iVar4 = cmCTest::GetMaxTestNameWidth
                          ((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
        std::operator+(&outname,&result->Name," ");
        std::__cxx11::string::resize((ulong)&outname,(char)iVar4 + '\x04');
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&testPath);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&testPath);
        poVar7 = std::operator<<(poVar7,"/");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7," MemCheck: #");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,result->TestCount);
        poVar7 = std::operator<<(poVar7,": ");
        poVar7 = std::operator<<(poVar7,(string *)&outname);
        poVar7 = std::operator<<(poVar7,"   Defects: ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_244);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,399,local_1c8[0],
                     (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testPath);
        std::__cxx11::string::~string((string *)&outname);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&testPath,"Log",(allocator<char> *)&outname);
      cmXMLWriter::StartElement(xml,&testPath);
      std::__cxx11::string::~string((string *)&testPath);
      bVar3 = cmCTest::ShouldCompressTestOutput
                        ((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
      if (bVar3) {
        cmCTest::CompressString
                  ((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,&output);
        cmXMLWriter::Attribute<char[5]>(xml,"compression",(char (*) [5])0x6a2f57);
        cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
      }
      cmXMLWriter::Content<std::__cxx11::string>(xml,&output);
      cmXMLWriter::EndElement(xml);
      cmCTestTestHandler::WriteTestResultFooter(&this->super_cmCTestTestHandler,xml,result);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&memcheckresults.super__Vector_base<int,_std::allocator<int>_>);
    std::__cxx11::string::~string((string *)&output);
    pcVar5 = (this->super_cmCTestTestHandler).TestResults.
             super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar8 = (this->super_cmCTestTestHandler).TestResults.
             super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&testPath);
  poVar7 = std::operator<<((ostream *)&testPath,
                           "MemCheck log files can be found here: (<#> corresponds to test number)")
  ;
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x1a0,output._M_dataplus._M_p,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testPath);
  std::__cxx11::string::string((string *)&output,(string *)&this->MemoryTesterOutputFile);
  cmsys::SystemTools::ReplaceString(&output,"??","<#>");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&testPath);
  poVar7 = std::operator<<((ostream *)&testPath,(string *)&output);
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x1a4,outname._M_dataplus._M_p,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  std::__cxx11::string::~string((string *)&outname);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testPath);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&testPath);
  poVar7 = std::operator<<((ostream *)&testPath,"Memory checking results:");
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x1a6,outname._M_dataplus._M_p,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  std::__cxx11::string::~string((string *)&outname);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testPath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testPath,"DefectList",(allocator<char> *)&outname);
  cmXMLWriter::StartElement(xml,&testPath);
  std::__cxx11::string::~string((string *)&testPath);
  lVar10 = 0;
  for (uVar11 = 0;
      piVar6 = (this->GlobalResults).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(this->GlobalResults).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
      uVar11 = uVar11 + 1) {
    if (piVar6[uVar11] != 0) {
      *(undefined8 *)(std::__basic_file<char>::is_open + *(long *)(std::cerr + -0x18)) = 0x23;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&testPath);
      poVar7 = std::operator<<((ostream *)&testPath,
                               (string *)
                               ((long)&(((this->ResultStringsLong).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar10));
      poVar7 = std::operator<<(poVar7," - ");
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,(this->GlobalResults).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar11]);
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x1ae,outname._M_dataplus._M_p,
                   (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
      std::__cxx11::string::~string((string *)&outname);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testPath);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&testPath,"Defect",(allocator<char> *)&outname);
      cmXMLWriter::StartElement(xml,&testPath);
      std::__cxx11::string::~string((string *)&testPath);
      cmXMLWriter::Attribute<std::__cxx11::string>
                (xml,"Type",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(((this->ResultStringsLong).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10));
      cmXMLWriter::EndElement(xml);
    }
    lVar10 = lVar10 + 0x20;
  }
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testPath,"EndDateTime",(allocator<char> *)&outname);
  cmXMLWriter::Element<std::__cxx11::string>
            (xml,&testPath,&(this->super_cmCTestTestHandler).EndTest);
  std::__cxx11::string::~string((string *)&testPath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testPath,"EndTestTime",(allocator<char> *)&outname);
  cmXMLWriter::
  Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            (xml,&testPath,&(this->super_cmCTestTestHandler).EndTestTime);
  std::__cxx11::string::~string((string *)&testPath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testPath,"ElapsedMinutes",(allocator<char> *)local_1c8);
  outname._M_dataplus._M_p =
       (pointer)(long)((this->super_cmCTestTestHandler).ElapsedTestingTime.__r / 60.0);
  cmXMLWriter::Element<long>(xml,&testPath,(long *)&outname);
  std::__cxx11::string::~string((string *)&testPath);
  cmXMLWriter::EndElement(xml);
  cmCTest::EndXML((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,xml);
  std::__cxx11::string::~string((string *)&output);
  return;
}

Assistant:

void cmCTestMemCheckHandler::GenerateCTestXML(cmXMLWriter& xml)
{
  if (!this->CTest->GetProduceXML()) {
    return;
  }
  this->CTest->StartXML(xml, this->AppendXML);
  this->CTest->GenerateSubprojectsOutput(xml);
  xml.StartElement("DynamicAnalysis");
  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND:
      xml.Attribute("Checker", "Valgrind");
      break;
    case cmCTestMemCheckHandler::DRMEMORY:
      xml.Attribute("Checker", "DrMemory");
      break;
    case cmCTestMemCheckHandler::PURIFY:
      xml.Attribute("Checker", "Purify");
      break;
    case cmCTestMemCheckHandler::BOUNDS_CHECKER:
      xml.Attribute("Checker", "BoundsChecker");
      break;
    case cmCTestMemCheckHandler::CUDA_SANITIZER:
      xml.Attribute("Checker", "CudaSanitizer");
      break;
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
      xml.Attribute("Checker", "AddressSanitizer");
      break;
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
      xml.Attribute("Checker", "LeakSanitizer");
      break;
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
      xml.Attribute("Checker", "ThreadSanitizer");
      break;
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
      xml.Attribute("Checker", "MemorySanitizer");
      break;
    case cmCTestMemCheckHandler::UB_SANITIZER:
      xml.Attribute("Checker", "UndefinedBehaviorSanitizer");
      break;
    default:
      xml.Attribute("Checker", "Unknown");
  }

  xml.Element("StartDateTime", this->StartTest);
  xml.Element("StartTestTime", this->StartTestTime);
  xml.StartElement("TestList");
  cmCTestMemCheckHandler::TestResultsVector::size_type cc;
  for (cmCTestTestResult const& result : this->TestResults) {
    std::string testPath = result.Path + "/" + result.Name;
    xml.Element("Test", this->CTest->GetShortPathToFile(testPath));
  }
  xml.EndElement(); // TestList
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "-- Processing memory checking output:\n", this->Quiet);
  size_t total = this->TestResults.size();
  for (cc = 0; cc < this->TestResults.size(); cc++) {
    cmCTestTestResult const& result = this->TestResults[cc];
    std::string memcheckstr;
    std::vector<int> memcheckresults(this->ResultStrings.size(), 0);
    bool res =
      this->ProcessMemCheckOutput(result.Output, memcheckstr, memcheckresults);
    if (res && result.Status == cmCTestMemCheckHandler::COMPLETED) {
      continue;
    }
    this->CleanTestOutput(
      memcheckstr,
      static_cast<size_t>(this->CustomMaximumFailedTestOutputSize),
      this->TestOutputTruncation);
    this->WriteTestResultHeader(xml, result);
    xml.StartElement("Results");
    int memoryErrors = 0;
    for (std::vector<int>::size_type kk = 0; kk < memcheckresults.size();
         ++kk) {
      if (memcheckresults[kk]) {
        xml.StartElement("Defect");
        xml.Attribute("type", this->ResultStringsLong[kk]);
        xml.Content(memcheckresults[kk]);
        memoryErrors += memcheckresults[kk];
        xml.EndElement(); // Defect
      }
      this->GlobalResults[kk] += memcheckresults[kk];
    }
    xml.EndElement(); // Results
    if (memoryErrors > 0) {
      const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
      std::string outname = result.Name + " ";
      outname.resize(maxTestNameWidth + 4, '.');
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         cc + 1 << "/" << total << " MemCheck: #"
                                << result.TestCount << ": " << outname
                                << "   Defects: " << memoryErrors << std::endl,
                         this->Quiet);
    }
    xml.StartElement("Log");
    if (this->CTest->ShouldCompressTestOutput()) {
      this->CTest->CompressString(memcheckstr);
      xml.Attribute("compression", "gzip");
      xml.Attribute("encoding", "base64");
    }
    xml.Content(memcheckstr);
    xml.EndElement(); // Log

    this->WriteTestResultFooter(xml, result);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "MemCheck log files can be found here: "
                     "(<#> corresponds to test number)"
                       << std::endl,
                     this->Quiet);
  std::string output = this->MemoryTesterOutputFile;
  cmSystemTools::ReplaceString(output, "??", "<#>");
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, output << std::endl,
                     this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "Memory checking results:" << std::endl, this->Quiet);
  xml.StartElement("DefectList");
  for (cc = 0; cc < this->GlobalResults.size(); cc++) {
    if (this->GlobalResults[cc]) {
      std::cerr.width(35);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         this->ResultStringsLong[cc]
                           << " - " << this->GlobalResults[cc] << std::endl,
                         this->Quiet);
      xml.StartElement("Defect");
      xml.Attribute("Type", this->ResultStringsLong[cc]);
      xml.EndElement();
    }
  }
  xml.EndElement(); // DefectList

  xml.Element("EndDateTime", this->EndTest);
  xml.Element("EndTestTime", this->EndTestTime);
  xml.Element(
    "ElapsedMinutes",
    std::chrono::duration_cast<std::chrono::minutes>(this->ElapsedTestingTime)
      .count());

  xml.EndElement(); // DynamicAnalysis
  this->CTest->EndXML(xml);
}